

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqlite_class.cpp
# Opt level: O0

void __thiscall SQLiteTestFixture::setup(SQLiteTestFixture *this)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  element_type *peVar3;
  lazy_ostream *plVar4;
  basic_cstring<const_char> local_418;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[125],_const_char_(&)[125]> local_408;
  assertion_result local_3e8;
  basic_cstring<const_char> local_3d0;
  basic_cstring<const_char> local_3c0;
  allocator<char> local_3a9;
  string local_3a8;
  statement local_388 [4];
  basic_cstring<const_char> local_300;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[126],_const_char_(&)[126]> local_2f0;
  assertion_result local_2d0;
  basic_cstring<const_char> local_2b8;
  basic_cstring<const_char> local_2a8;
  allocator<char> local_291;
  string local_290;
  statement local_270 [4];
  basic_cstring<const_char> local_1e8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[125],_const_char_(&)[125]> local_1d8;
  assertion_result local_1b8;
  basic_cstring<const_char> local_1a0;
  basic_cstring<const_char> local_190;
  allocator<char> local_179;
  string local_178;
  statement local_158 [4];
  basic_cstring<const_char> local_d0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[133],_const_char_(&)[133]> local_c0;
  assertion_result local_a0;
  basic_cstring<const_char> local_88;
  basic_cstring<const_char> local_78 [2];
  allocator<char> local_51;
  string local_50;
  statement local_30;
  SQLiteTestFixture *local_10;
  SQLiteTestFixture *this_local;
  
  local_10 = this;
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"create table TEST_TABLE(COL1 INT NOT NULL, COL2 VARCHAR(50));",
               &local_51);
    peVar3 = std::__shared_ptr_access<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    cpp_db::statement::statement(&local_30,&local_50,peVar3);
    cpp_db::statement::execute_non_query(&local_30);
    cpp_db::statement::~statement(&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    do {
      puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (local_78,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
                 ,0x69);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_88);
      boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,local_78,0x1b,&local_88);
      boost::test_tools::assertion_result::assertion_result(&local_a0,true);
      plVar4 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (&local_c0,plVar4,
                 (char (*) [133])
                 "no exceptions thrown by cpp_db::statement(\"create table TEST_TABLE(COL1 INT NOT NULL, COL2 VARCHAR(50));\", *con).execute_non_query()"
                );
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_d0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
                 ,0x69);
      boost::test_tools::tt_detail::report_assertion
                (&local_a0,&local_c0.super_lazy_ostream,&local_d0,0x1b,CHECK,CHECK_MSG,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[133],_const_char_(&)[133]>::
      ~lazy_ostream_impl(&local_c0);
      boost::test_tools::assertion_result::~assertion_result(&local_a0);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"insert into TEST_TABLE(COL1, COL2) VALUES(1, \'first\')",
               &local_179);
    peVar3 = std::__shared_ptr_access<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    cpp_db::statement::statement(local_158,&local_178,peVar3);
    cpp_db::statement::execute_non_query(local_158);
    cpp_db::statement::~statement(local_158);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator(&local_179);
    do {
      puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_190,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
                 ,0x69);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1a0);
      boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_190,0x1c,&local_1a0);
      boost::test_tools::assertion_result::assertion_result(&local_1b8,true);
      plVar4 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (&local_1d8,plVar4,
                 (char (*) [125])
                 "no exceptions thrown by cpp_db::statement(\"insert into TEST_TABLE(COL1, COL2) VALUES(1, \'first\')\", *con).execute_non_query()"
                );
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_1e8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
                 ,0x69);
      boost::test_tools::tt_detail::report_assertion
                (&local_1b8,&local_1d8.super_lazy_ostream,&local_1e8,0x1c,CHECK,CHECK_MSG,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[125],_const_char_(&)[125]>::
      ~lazy_ostream_impl(&local_1d8);
      boost::test_tools::assertion_result::~assertion_result(&local_1b8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290,"insert into TEST_TABLE(COL1, COL2) VALUES(2, \'second\')",
               &local_291);
    peVar3 = std::__shared_ptr_access<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    cpp_db::statement::statement(local_270,&local_290,peVar3);
    cpp_db::statement::execute_non_query(local_270);
    cpp_db::statement::~statement(local_270);
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator(&local_291);
    do {
      puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_2a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
                 ,0x69);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2b8);
      boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_2a8,0x1d,&local_2b8);
      boost::test_tools::assertion_result::assertion_result(&local_2d0,true);
      plVar4 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (&local_2f0,plVar4,
                 (char (*) [126])
                 "no exceptions thrown by cpp_db::statement(\"insert into TEST_TABLE(COL1, COL2) VALUES(2, \'second\')\", *con).execute_non_query()"
                );
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_300,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
                 ,0x69);
      boost::test_tools::tt_detail::report_assertion
                (&local_2d0,&local_2f0.super_lazy_ostream,&local_300,0x1d,CHECK,CHECK_MSG,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[126],_const_char_(&)[126]>::
      ~lazy_ostream_impl(&local_2f0);
      boost::test_tools::assertion_result::~assertion_result(&local_2d0);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a8,"insert into TEST_TABLE(COL1, COL2) VALUES(3, \'third\')",
               &local_3a9);
    peVar3 = std::__shared_ptr_access<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    cpp_db::statement::statement(local_388,&local_3a8,peVar3);
    cpp_db::statement::execute_non_query(local_388);
    cpp_db::statement::~statement(local_388);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::allocator<char>::~allocator(&local_3a9);
    do {
      puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_3c0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
                 ,0x69);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3d0);
      boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_3c0,0x1e,&local_3d0);
      boost::test_tools::assertion_result::assertion_result(&local_3e8,true);
      plVar4 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (&local_408,plVar4,
                 (char (*) [125])
                 "no exceptions thrown by cpp_db::statement(\"insert into TEST_TABLE(COL1, COL2) VALUES(3, \'third\')\", *con).execute_non_query()"
                );
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_418,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
                 ,0x69);
      boost::test_tools::tt_detail::report_assertion
                (&local_3e8,&local_408.super_lazy_ostream,&local_418,0x1e,CHECK,CHECK_MSG,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[125],_const_char_(&)[125]>::
      ~lazy_ostream_impl(&local_408);
      boost::test_tools::assertion_result::~assertion_result(&local_3e8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

void setup()
    {
        BOOST_CHECK_NO_THROW(cpp_db::statement("create table TEST_TABLE(COL1 INT NOT NULL, COL2 VARCHAR(50));", *con).execute_non_query());
        BOOST_CHECK_NO_THROW(cpp_db::statement("insert into TEST_TABLE(COL1, COL2) VALUES(1, 'first')", *con).execute_non_query());
        BOOST_CHECK_NO_THROW(cpp_db::statement("insert into TEST_TABLE(COL1, COL2) VALUES(2, 'second')", *con).execute_non_query());
        BOOST_CHECK_NO_THROW(cpp_db::statement("insert into TEST_TABLE(COL1, COL2) VALUES(3, 'third')", *con).execute_non_query());
    }